

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThread.cpp
# Opt level: O2

void __thiscall EventLoopThread::threadFunc(EventLoopThread *this)

{
  undefined1 local_98 [8];
  EventLoop loop;
  
  EventLoop::EventLoop((EventLoop *)local_98);
  pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  this->loop_ = (EventLoop *)local_98;
  pthread_cond_signal((pthread_cond_t *)&(this->cond_).cond);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  EventLoop::loop((EventLoop *)local_98);
  this->loop_ = (EventLoop *)0x0;
  EventLoop::~EventLoop((EventLoop *)local_98);
  return;
}

Assistant:

void EventLoopThread::threadFunc() {
  EventLoop loop;

  {
    MutexLockGuard lock(mutex_);
    loop_ = &loop;
    cond_.notify();
  }

  loop.loop();
  // assert(exiting_);
  loop_ = NULL;
}